

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

bool __thiscall
ON_SimpleArray<ON_Value_*>::Sort
          (ON_SimpleArray<ON_Value_*> *this,sort_algorithm sa,int *index,
          _func_int_ON_Value_ptr_ptr_ON_Value_ptr_ptr *compar)

{
  bool local_29;
  bool rc;
  _func_int_ON_Value_ptr_ptr_ON_Value_ptr_ptr *compar_local;
  int *index_local;
  sort_algorithm sa_local;
  ON_SimpleArray<ON_Value_*> *this_local;
  
  local_29 = false;
  if ((((this->m_a != (ON_Value **)0x0) && (0 < this->m_count)) &&
      (compar != (_func_int_ON_Value_ptr_ptr_ON_Value_ptr_ptr *)0x0)) && (index != (int *)0x0)) {
    if (this->m_count < 2) {
      if (this->m_count == 1) {
        *index = 0;
      }
    }
    else {
      ON_Sort(sa,index,this->m_a,(long)this->m_count,8,(_func_int_void_ptr_void_ptr *)compar);
    }
    local_29 = true;
  }
  return local_29;
}

Assistant:

bool ON_SimpleArray<T>::Sort( ON::sort_algorithm sa, int* index, int (*compar)(const T*,const T*) ) const
{
  bool rc = false;
  if ( m_a && m_count > 0 && compar && index ) {
    if ( m_count > 1 )
      ON_Sort(sa, index, m_a, m_count, sizeof(T), (int(*)(const void*,const void*))compar );
    else if ( m_count == 1 )
      index[0] = 0;
    rc = true;
  }
  return rc;
}